

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorUtils.cpp
# Opt level: O0

void __thiscall
HFactor::reportDoubleVector
          (HFactor *this,string *name,vector<double,_std::allocator<double>_> *entry)

{
  size_type sVar1;
  undefined8 uVar2;
  size_type sVar3;
  const_reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RDX;
  HighsInt iEn;
  HighsInt num_en;
  int local_20;
  
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  uVar2 = std::__cxx11::string::c_str();
  sVar3 = std::vector<double,_std::allocator<double>_>::capacity(in_RDX);
  printf("%-12s: siz %4d; cap %4d: ",uVar2,sVar1 & 0xffffffff,sVar3 & 0xffffffff);
  for (local_20 = 0; local_20 < (int)sVar1; local_20 = local_20 + 1) {
    if ((0 < local_20) && (local_20 % 10 == 0)) {
      printf("\n                                  ");
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_20);
    printf("%11.4g ",*pvVar4);
  }
  printf("\n");
  return;
}

Assistant:

void HFactor::reportDoubleVector(const std::string name,
                                 const vector<double> entry) const {
  const HighsInt num_en = entry.size();
  printf("%-12s: siz %4d; cap %4d: ", name.c_str(), (int)num_en,
         (int)entry.capacity());
  for (HighsInt iEn = 0; iEn < num_en; iEn++) {
    if (iEn > 0 && iEn % 10 == 0)
      printf("\n                                  ");
    printf("%11.4g ", entry[iEn]);
  }
  printf("\n");
}